

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH64_hash_t XXH3_len_1to3_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  ulong uVar1;
  long in_R8;
  
  uVar1 = (ulong)((uint)secret ^ (uint)seed) + in_R8;
  uVar1 = (uVar1 >> 0x21 ^ uVar1 ^
          ((ulong)input[len - 1] |
          (ulong)((int)len << 8 | (uint)*input << 0x10 | (uint)input[len >> 1] << 0x18))) *
          -0x3d4d51c2d82b14b1;
  uVar1 = (uVar1 >> 0x1d ^ uVar1) * 0x165667b19e3779f9;
  return uVar1 >> 0x20 ^ uVar1;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t XXH3_len_1to3_64b(const xxh_u8* input, size_t len,
                                                const xxh_u8* secret,
                                                XXH64_hash_t seed) {
  XXH_ASSERT(input != NULL);
  XXH_ASSERT(1 <= len && len <= 3);
  XXH_ASSERT(secret != NULL);
  /*
   * len = 1: combined = { input[0], 0x01, input[0], input[0] }
   * len = 2: combined = { input[1], 0x02, input[0], input[1] }
   * len = 3: combined = { input[2], 0x03, input[0], input[1] }
   */
  {
    xxh_u8 const c1 = input[0];
    xxh_u8 const c2 = input[len >> 1];
    xxh_u8 const c3 = input[len - 1];
    xxh_u32 const combined = ((xxh_u32)c1 << 16) | ((xxh_u32)c2 << 24) |
                             ((xxh_u32)c3 << 0) | ((xxh_u32)len << 8);
    xxh_u64 const bitflip =
        (XXH_readLE32(secret) ^ XXH_readLE32(secret + 4)) + seed;
    xxh_u64 const keyed = (xxh_u64)combined ^ bitflip;
    return XXH64_avalanche(keyed);
  }
}